

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::~UCIAdapter(UCIAdapter *this)

{
  UCIAdapter *this_local;
  
  this->_vptr_UCIAdapter = (_func_int **)&PTR__UCIAdapter_00187b98;
  this->engine = (ChessEngine *)0x0;
  std::__cxx11::string::~string((string *)&this->lastPosition);
  Thread::~Thread(&this->thread);
  return;
}

Assistant:

UCIAdapter::~UCIAdapter()
{
  engine = NULL;
}